

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O1

void Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_1,_false,_0>::
     run(long rows,long cols,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,
        ResScalar *res,long resStride,ResScalar alpha,level3_blocking<double,_double> *blocking,
        GemmParallelInfo<long> *info)

{
  double *rhs;
  ResScalar alpha_00;
  long depth_00;
  long lhsStride_00;
  RhsScalar cols_00;
  LhsScalar *pLVar1;
  RhsScalar *pRVar2;
  long lVar3;
  undefined8 *puVar4;
  double *pdVar5;
  ResScalar *pRVar6;
  long lVar7;
  size_t __size;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double dStack_108;
  ResScalar *local_100;
  ResScalar *local_f8;
  long local_f0;
  ResScalar local_e8;
  long local_e0;
  double *local_d8;
  long local_d0;
  double *local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  long local_98;
  RhsScalar local_90;
  long local_88;
  RhsScalar *local_80;
  LhsScalar *local_78;
  ulong local_70;
  RhsScalar *local_68;
  ulong local_60;
  LhsScalar *local_58;
  RhsScalar *local_50;
  RhsScalar *local_48;
  ulong local_40;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_33;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> local_32;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_31 [6];
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp;
  
  pdVar5 = &dStack_108;
  local_e8 = alpha;
  local_c8 = _rhs;
  local_a8 = lhsStride;
  local_90 = (RhsScalar)cols;
  local_f0 = rows;
  local_88 = blocking->m_mc;
  if (rows <= blocking->m_mc) {
    local_88 = rows;
  }
  local_40 = blocking->m_kc;
  uVar9 = local_88 * blocking->m_kc;
  if (uVar9 >> 0x3d == 0) {
    if (blocking->m_blockA == (LhsScalar *)0x0) {
      if (uVar9 < 0x4001) {
        pdVar5 = (double *)((long)&dStack_108 - (uVar9 * 8 + 0xf & 0xfffffffffffffff0));
        local_58 = pdVar5;
        local_78 = pdVar5;
      }
      else {
        local_78 = (LhsScalar *)malloc(uVar9 * 8);
        local_58 = local_78;
        if (local_78 == (LhsScalar *)0x0) goto LAB_0010a1c3;
      }
    }
    else {
      local_78 = blocking->m_blockA;
      local_58 = (LhsScalar *)0x0;
      pdVar5 = &dStack_108;
    }
    uVar10 = local_40 * (long)local_90;
    if (0x1fffffffffffffff < uVar10) {
      pdVar5[-1] = 5.3855279878973e-318;
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = operator_delete;
      pdVar5[-1] = 5.3857058515298e-318;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_68 = blocking->m_blockB;
    if (blocking->m_blockB == (RhsScalar *)0x0) {
      if (uVar10 < 0x4001) {
        pdVar5 = (double *)((long)pdVar5 - (uVar10 * 8 + 0xf & 0xfffffffffffffff0));
        local_50 = pdVar5;
        local_68 = pdVar5;
      }
      else {
        pdVar5[-1] = 5.38178297030182e-318;
        local_68 = (RhsScalar *)malloc(uVar10 * 8);
        local_50 = local_68;
        if (local_68 == (RhsScalar *)0x0) {
          pdVar5[-1] = 5.38598252829147e-318;
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar4 = operator_delete;
          pdVar5[-1] = 5.38616039192398e-318;
          __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
    }
    else {
      local_50 = (RhsScalar *)0x0;
    }
    if ((local_40 & 0x1c00000000000000) == 0) {
      local_80 = blocking->m_blockW;
      local_60 = uVar9;
      local_70 = uVar10;
      if (blocking->m_blockW == (RhsScalar *)0x0) {
        __size = local_40 * 0x40;
        if (__size < 0x20001) {
          pdVar5 = pdVar5 + local_40 * -8;
          local_48 = pdVar5;
          local_80 = pdVar5;
        }
        else {
          pdVar5[-1] = 5.38236102710746e-318;
          local_80 = (RhsScalar *)malloc(__size);
          local_48 = local_80;
          if (local_80 == (RhsScalar *)0x0) {
            pdVar5[-1] = 5.38620979848856e-318;
            puVar4 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar4 = operator_delete;
            pdVar5[-1] = (double)&LAB_0010a2a9;
            __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
        }
      }
      else {
        local_48 = (RhsScalar *)0x0;
      }
      pLVar1 = local_78;
      local_a0 = local_40 << 6;
      if (0 < depth) {
        local_b8 = local_40 * local_a8 * 8;
        local_e0 = local_88 * 8;
        local_c0 = depth;
        lVar3 = 0;
        do {
          local_d0 = local_40 + lVar3;
          lVar8 = local_c0;
          if (local_d0 < local_c0) {
            lVar8 = local_d0;
          }
          rhs = local_c8 + lVar3 * rhsStride;
          pdVar5[-2] = 0.0;
          pdVar5[-1] = 0.0;
          pRVar2 = local_68;
          cols_00 = local_90;
          local_b0 = lVar8 - lVar3;
          pdVar5[-3] = 5.38326516723935e-318;
          gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
                    (&local_32,pRVar2,rhs,rhsStride,lVar8 - lVar3,(long)cols_00,(long)pdVar5[-2],
                     (long)pdVar5[-1]);
          lVar11 = 0;
          local_d8 = _lhs;
          lVar3 = 0;
          pRVar6 = res;
          lVar8 = local_88;
          while( true ) {
            depth_00 = local_b0;
            lVar7 = lVar8;
            if (local_f0 < lVar8) {
              lVar7 = local_f0;
            }
            if (local_f0 <= lVar3) break;
            lVar7 = lVar7 + lVar11;
            pdVar5[-2] = 0.0;
            pdVar5[-1] = 0.0;
            lhsStride_00 = local_a8;
            local_100 = pRVar6;
            local_98 = lVar3;
            pdVar5[-3] = 5.38380863944977e-318;
            gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                      (&local_33,pLVar1,_lhs,lhsStride_00,depth_00,lVar7,(long)pdVar5[-2],
                       (long)pdVar5[-1]);
            pRVar6 = local_100;
            local_98 = local_98 + local_88;
            _lhs = (double *)((long)_lhs + local_e0);
            lVar8 = lVar8 + local_88;
            lVar11 = lVar11 - local_88;
            local_f8 = (ResScalar *)((long)local_100 + local_e0);
            pdVar5[-2] = (double)local_80;
            pdVar5[-4] = 0.0;
            pdVar5[-3] = 0.0;
            pdVar5[-5] = -NAN;
            pdVar5[-6] = -NAN;
            pdVar5[-7] = local_90;
            pdVar5[-8] = (double)local_b0;
            pRVar2 = local_68;
            alpha_00 = local_e8;
            pdVar5[-9] = 5.38455467857499e-318;
            gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                      (local_31,pRVar6,resStride,pLVar1,pRVar2,lVar7,(long)pdVar5[-8],
                       (long)pdVar5[-7],alpha_00,(long)pdVar5[-6],(long)pdVar5[-5],(long)pdVar5[-4],
                       (long)pdVar5[-3],(double *)pdVar5[-2]);
            lVar3 = local_98;
            pRVar6 = local_f8;
          }
          _lhs = (double *)((long)local_d8 + local_b8);
          lVar3 = local_d0;
        } while (local_d0 < local_c0);
      }
      pRVar2 = local_48;
      if (0x20000 < local_a0) {
        pdVar5[-1] = 5.38497463437396e-318;
        free(pRVar2);
      }
      pRVar2 = local_50;
      uVar9 = local_60;
      if (0x4000 < local_70) {
        pdVar5[-1] = 5.3850882694725e-318;
        free(pRVar2);
      }
      pLVar1 = local_58;
      if (0x4000 < uVar9) {
        pdVar5[-1] = 5.38517720128875e-318;
        free(pLVar1);
      }
      return;
    }
    pdVar5[-1] = 5.38575525809439e-318;
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = operator_delete;
    pdVar5[-1] = 5.38593312172689e-318;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
LAB_0010a1c3:
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = operator_delete;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static void run(Index rows, Index cols, Index depth,
  const LhsScalar* _lhs, Index lhsStride,
  const RhsScalar* _rhs, Index rhsStride,
  ResScalar* res, Index resStride,
  ResScalar alpha,
  level3_blocking<LhsScalar,RhsScalar>& blocking,
  GemmParallelInfo<Index>* info = 0)
{
  const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> lhs(_lhs,lhsStride);
  const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> rhs(_rhs,rhsStride);

  typedef gebp_traits<LhsScalar,RhsScalar> Traits;

  Index kc = blocking.kc();                   // cache block size along the K direction
  Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction
  //Index nc = blocking.nc(); // cache block size along the N direction

  gemm_pack_lhs<LhsScalar, Index, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
  gemm_pack_rhs<RhsScalar, Index, Traits::nr, RhsStorageOrder> pack_rhs;
  gebp_kernel<LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;

#ifdef EIGEN_HAS_OPENMP
  if(info)
  {
    // this is the parallel version!
    Index tid = omp_get_thread_num();
    Index threads = omp_get_num_threads();
    
    std::size_t sizeA = kc*mc;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;
    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, 0);
    ei_declare_aligned_stack_constructed_variable(RhsScalar, w, sizeW, 0);
    
    RhsScalar* blockB = blocking.blockB();
    eigen_internal_assert(blockB!=0);

    // For each horizontal panel of the rhs, and corresponding vertical panel of the lhs...
    for(Index k=0; k<depth; k+=kc)
    {
      const Index actual_kc = (std::min)(k+kc,depth)-k; // => rows of B', and cols of the A'

      // In order to reduce the chance that a thread has to wait for the other,
      // let's start by packing A'.
      pack_lhs(blockA, &lhs(0,k), lhsStride, actual_kc, mc);

      // Pack B_k to B' in a parallel fashion:
      // each thread packs the sub block B_k,j to B'_j where j is the thread id.

      // However, before copying to B'_j, we have to make sure that no other thread is still using it,
      // i.e., we test that info[tid].users equals 0.
      // Then, we set info[tid].users to the number of threads to mark that all other threads are going to use it.
      while(info[tid].users!=0) {}
      info[tid].users += threads;

      pack_rhs(blockB+info[tid].rhs_start*actual_kc, &rhs(k,info[tid].rhs_start), rhsStride, actual_kc, info[tid].rhs_length);

      // Notify the other threads that the part B'_j is ready to go.
      info[tid].sync = k;

      // Computes C_i += A' * B' per B'_j
      for(Index shift=0; shift<threads; ++shift)
      {
        Index j = (tid+shift)%threads;

        // At this point we have to make sure that B'_j has been updated by the thread j,
        // we use testAndSetOrdered to mimic a volatile access.
        // However, no need to wait for the B' part which has been updated by the current thread!
        if(shift>0)
          while(info[j].sync!=k) {}

        gebp(res+info[j].rhs_start*resStride, resStride, blockA, blockB+info[j].rhs_start*actual_kc, mc, actual_kc, info[j].rhs_length, alpha, -1,-1,0,0, w);
      }

      // Then keep going as usual with the remaining A'
      for(Index i=mc; i<rows; i+=mc)
      {
        const Index actual_mc = (std::min)(i+mc,rows)-i;

        // pack A_i,k to A'
        pack_lhs(blockA, &lhs(i,k), lhsStride, actual_kc, actual_mc);

        // C_i += A' * B'
        gebp(res+i, resStride, blockA, blockB, actual_mc, actual_kc, cols, alpha, -1,-1,0,0, w);
      }

      // Release all the sub blocks B'_j of B' for the current thread,
      // i.e., we simply decrement the number of users by 1
      for(Index j=0; j<threads; ++j)
      {
        #pragma omp atomic
        info[j].users -= 1;
      }
    }
  }
  else
#endif // EIGEN_HAS_OPENMP
  {
    EIGEN_UNUSED_VARIABLE(info);

    // this is the sequential version!
    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockW, sizeW, blocking.blockW());

    // For each horizontal panel of the rhs, and corresponding panel of the lhs...
    // (==GEMM_VAR1)
    for(Index k2=0; k2<depth; k2+=kc)
    {
      const Index actual_kc = (std::min)(k2+kc,depth)-k2;

      // OK, here we have selected one horizontal panel of rhs and one vertical panel of lhs.
      // => Pack rhs's panel into a sequential chunk of memory (L2 caching)
      // Note that this panel will be read as many times as the number of blocks in the lhs's
      // vertical panel which is, in practice, a very low number.
      pack_rhs(blockB, &rhs(k2,0), rhsStride, actual_kc, cols);

      // For each mc x kc block of the lhs's vertical panel...
      // (==GEPP_VAR1)
      for(Index i2=0; i2<rows; i2+=mc)
      {
        const Index actual_mc = (std::min)(i2+mc,rows)-i2;

        // We pack the lhs's block into a sequential chunk of memory (L1 caching)
        // Note that this block will be read a very high number of times, which is equal to the number of
        // micro vertical panel of the large rhs's panel (e.g., cols/4 times).
        pack_lhs(blockA, &lhs(i2,k2), lhsStride, actual_kc, actual_mc);

        // Everything is packed, we can now call the block * panel kernel:
        gebp(res+i2, resStride, blockA, blockB, actual_mc, actual_kc, cols, alpha, -1, -1, 0, 0, blockW);
      }
    }
  }
}